

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int queue_segment_set_out(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  long *plVar1;
  uint local_34;
  uint32_t i;
  queue_segment_data *data;
  mixed_segment *segment_local;
  void *buffer_local;
  uint32_t location_local;
  uint32_t field_local;
  
  plVar1 = (long *)segment->data;
  if (field == 0) {
    if (location < *(uint *)(plVar1 + 3)) {
      *(void **)(plVar1[2] + (ulong)location * 8) = buffer;
      for (local_34 = 0; local_34 < *(uint *)(plVar1 + 1); local_34 = local_34 + 1) {
        mixed_segment_set_out(0,location,buffer,*(mixed_segment **)(*plVar1 + (ulong)local_34 * 8));
      }
      location_local = 1;
    }
    else {
      mixed_err(6);
      location_local = 0;
    }
  }
  else {
    mixed_err(7);
    location_local = 0;
  }
  return location_local;
}

Assistant:

int queue_segment_set_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(location < data->out_count){
      data->out[location] = (struct mixed_buffer *)buffer;
      // Update existing segments in the queue.
      for(uint32_t i=0; i<data->count; ++i){
        mixed_segment_set_out(MIXED_BUFFER, location, buffer, data->queue[i]);
      }
      return 1;
    }
    mixed_err(MIXED_INVALID_LOCATION);
    return 0;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}